

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_next_window.cpp
# Opt level: O2

vector<rw::Window_*,_std::allocator<rw::Window_*>_> *
rw::window_with_greatest_perpendicular_overlap
          (vector<rw::Window_*,_std::allocator<rw::Window_*>_> *__return_storage_ptr__,
          Window *focused_window,vector<rw::Window_*,_std::allocator<rw::Window_*>_> *other_windows,
          Direction *direction)

{
  pointer ppWVar1;
  pointer ppWVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int unaff_R13D;
  Window **other;
  pointer __x;
  tuple<int,_int> other_range;
  tuple<int,_int> focused_range;
  _Tuple_impl<0UL,_int,_int> local_50;
  _Tuple_impl<0UL,_int,_int> local_48;
  _Tuple_impl<0UL,_int,_int> local_40;
  _Tuple_impl<0UL,_int,_int> local_38;
  
  (**(code **)(*(long *)direction + 0x28))(&local_38,direction,focused_window);
  (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppWVar1 = (other_windows->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  bVar6 = 0;
  for (__x = (other_windows->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>).
             _M_impl.super__Vector_impl_data._M_start; __x != ppWVar1; __x = __x + 1) {
    (**(code **)(*(long *)direction + 0x28))(&local_40,direction,*__x);
    local_48 = local_38;
    local_50 = local_40;
    iVar3 = overlap_length((tuple<int,_int> *)&local_48,(tuple<int,_int> *)&local_50);
    if ((!(bool)(bVar6 & iVar3 - unaff_R13D < 0x33)) &&
       (ppWVar2 = (__return_storage_ptr__->
                  super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
                  super__Vector_impl_data._M_start, unaff_R13D = iVar3,
       (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>).
       _M_impl.super__Vector_impl_data._M_finish != ppWVar2)) {
      (__return_storage_ptr__->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = ppWVar2;
    }
    uVar4 = iVar3 - unaff_R13D;
    uVar5 = -uVar4;
    if (0 < (int)uVar4) {
      uVar5 = uVar4;
    }
    if (uVar5 < 0x33) {
      std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::push_back
                (__return_storage_ptr__,__x);
    }
    bVar6 = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Window*> window_with_greatest_perpendicular_overlap(
            Window* focused_window,
            const vector<Window*> other_windows,
            Direction * direction)
    {
        auto focused_range = direction->perpendicular_range(focused_window);

        bool best_overlap_set = false;
        int best_overlap;
        vector<Window*> best_windows;

        for (auto& other : other_windows) {
            auto other_range = direction->perpendicular_range(other);

            int overlap = overlap_length(focused_range, other_range);
            // Note: small overlap differences as treated as if there was no
            // difference. This is because in practice these small differences
            // are side effects of splitting the screen when the height or width
            // is not even.
            const int small_difference = 50;

            if (!best_overlap_set || (overlap - best_overlap > small_difference)) {
                best_overlap_set = true;
                best_overlap = overlap;
                best_windows.clear();
            }

            if (abs(overlap - best_overlap) <= small_difference) {
                best_windows.push_back(other);
            }
        }

        return best_windows;
    }